

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpprotocolhandler.cpp
# Opt level: O0

void __thiscall QHttpProtocolHandler::_q_readyRead(QHttpProtocolHandler *this)

{
  bool bVar1;
  SocketState SVar2;
  long lVar3;
  long *in_RDI;
  long in_FS_OFFSET;
  qint64 ret;
  char c;
  SocketError in_stack_00000044;
  QHttpNetworkConnectionChannel *in_stack_00000048;
  QIODevice *in_stack_ffffffffffffffd0;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  SVar2 = QSocketAbstraction::socketState(in_stack_ffffffffffffffd0);
  if ((SVar2 == ConnectedState) && (lVar3 = (**(code **)(*(long *)in_RDI[3] + 0xa0))(), lVar3 == 0))
  {
    local_9 = 0xaa;
    lVar3 = QIODevice::peek((char *)in_RDI[3],(longlong)&local_9);
    if (lVar3 < 0) {
      QSocketAbstraction::socketError((QIODevice *)in_RDI[1]);
      QHttpNetworkConnectionChannel::_q_error(in_stack_00000048,in_stack_00000044);
      if (in_RDI[2] != 0) {
        (**(code **)(*in_RDI + 0x10))();
      }
      goto LAB_0030be1e;
    }
  }
  bVar1 = QHttpNetworkConnectionChannel::isSocketWaiting((QHttpNetworkConnectionChannel *)in_RDI[1])
  ;
  if ((bVar1) ||
     (bVar1 = QHttpNetworkConnectionChannel::isSocketReading
                        ((QHttpNetworkConnectionChannel *)in_RDI[1]), bVar1)) {
    lVar3 = (**(code **)(*(long *)in_RDI[3] + 0xa0))();
    if (lVar3 != 0) {
      *(undefined4 *)(in_RDI[1] + 0x20) = 8;
    }
    if (in_RDI[2] != 0) {
      (**(code **)(*in_RDI + 0x10))();
    }
  }
LAB_0030be1e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpProtocolHandler::_q_readyRead()
{
    if (QSocketAbstraction::socketState(m_socket) == QAbstractSocket::ConnectedState
        && m_socket->bytesAvailable() == 0) {
        // We got a readyRead but no bytes are available..
        // This happens for the Unbuffered QTcpSocket
        // Also check if socket is in ConnectedState since
        // this function may also be invoked via the event loop.
        char c;
        qint64  ret = m_socket->peek(&c, 1);
        if (ret < 0) {
            m_channel->_q_error(QSocketAbstraction::socketError(m_socket));
            // We still need to handle the reply so it emits its signals etc.
            if (m_reply)
                _q_receiveReply();
            return;
        }
    }

    if (m_channel->isSocketWaiting() || m_channel->isSocketReading()) {
        if (m_socket->bytesAvailable()) {
            // We might get a spurious call from readMoreLater()
            // call of the QHttpNetworkConnection even while the socket is disconnecting.
            // Therefore check if there is actually bytes available before changing the channel state.
            m_channel->state = QHttpNetworkConnectionChannel::ReadingState;
        }
        if (m_reply)
            _q_receiveReply();
    }
}